

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_xformOps_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *xformOps,uint32_t indent)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  ulong uVar6;
  value *this_00;
  size_type sVar7;
  ostream *poVar8;
  value_type *this_01;
  uint32_t indent_00;
  uint32_t n;
  OpType *op;
  undefined1 in_R8B;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string local_468;
  string local_448;
  optional<tinyusdz::value::TimeSamples> local_428;
  undefined1 local_400 [8];
  optional<tinyusdz::value::TimeSamples> pv_1;
  string local_3b8;
  _Base_ptr local_398;
  undefined1 local_390;
  value_type local_388 [4];
  key_type local_368 [4];
  string local_348;
  optional<tinyusdz::value::Value> local_328;
  undefined1 local_308 [8];
  optional<tinyusdz::value::Value> pv;
  string local_2c8;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  string local_298 [32];
  undefined1 local_278 [8];
  string varname;
  undefined1 local_250 [8];
  value_type xformOp;
  size_t i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  printed_vars;
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *xformOps_local;
  
  sVar4 = (size_type)indent;
  local_1c = (uint)xformOps;
  ptStack_18 = this;
  xformOps_local =
       (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream
            ((stringstream *)&printed_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&i);
  sVar3 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::size
                    ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)ptStack_18);
  if (sVar3 != 0) {
    xformOp._is_blocked = false;
    xformOp._105_7_ = 0;
    for (; uVar1 = xformOp._104_8_,
        sVar4 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::size
                          ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)
                           ptStack_18), (ulong)uVar1 < sVar4; xformOp._104_8_ = xformOp._104_8_ + 1)
    {
      pvVar5 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::operator[]
                         ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)
                          ptStack_18,xformOp._104_8_);
      indent_00 = (uint32_t)sVar4;
      XformOp::XformOp((XformOp *)local_250,pvVar5);
      if (local_250._0_4_ == ResetXformStack) {
        varname.field_2._12_4_ = 4;
      }
      else {
        to_string_abi_cxx11_((string *)local_278,(tinyusdz *)local_250,op);
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          ::std::operator+((char *)local_298,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x58567c);
          ::std::__cxx11::string::operator+=((string *)local_278,local_298);
          ::std::__cxx11::string::~string(local_298);
        }
        bVar2 = XformOp::has_default((XformOp *)local_250);
        if (bVar2) {
          sVar7 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,(key_type *)local_278);
          if (sVar7 == 0) {
            pVar9 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&i,(value_type_conflict *)local_278);
            local_2a8 = (_Base_ptr)pVar9.first._M_node;
            local_2a0 = pVar9.second;
            pprint::Indent_abi_cxx11_(&local_2c8,(pprint *)(ulong)local_1c,pVar9._8_4_);
            ::std::operator<<(aoStack_198,(string *)&local_2c8);
            ::std::__cxx11::string::~string((string *)&local_2c8);
            XformOp::get_value_type_name_abi_cxx11_
                      ((string *)((long)&pv.contained + 0x10),(XformOp *)local_250);
            poVar8 = ::std::operator<<(aoStack_198,(string *)((long)&pv.contained + 0x10));
            ::std::operator<<(poVar8," ");
            ::std::__cxx11::string::~string((string *)((long)&pv.contained + 0x10));
            ::std::operator<<(aoStack_198,(string *)local_278);
            ::std::operator<<(aoStack_198," = ");
            bVar2 = XformOp::is_blocked((XformOp *)local_250);
            if (bVar2) {
              ::std::operator<<(aoStack_198,"None");
            }
            else {
              XformOp::get_scalar(&local_328,(XformOp *)local_250);
              nonstd::optional_lite::optional<tinyusdz::value::Value>::
              optional<tinyusdz::value::Value,_0>
                        ((optional<tinyusdz::value::Value> *)local_308,&local_328);
              nonstd::optional_lite::optional<tinyusdz::value::Value>::~optional(&local_328);
              bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_308);
              if (bVar2) {
                this_00 = (value *)nonstd::optional_lite::optional<tinyusdz::value::Value>::value
                                             ((optional<tinyusdz::value::Value> *)local_308);
                indent_00 = 1;
                value::pprint_value_abi_cxx11_
                          (&local_348,this_00,(Value *)(ulong)local_1c,1,(bool)in_R8B);
                ::std::operator<<(aoStack_198,(string *)&local_348);
                ::std::__cxx11::string::~string((string *)&local_348);
              }
              else {
                ::std::operator<<(aoStack_198,"[InternalError]");
              }
              nonstd::optional_lite::optional<tinyusdz::value::Value>::~optional
                        ((optional<tinyusdz::value::Value> *)local_308);
            }
            ::std::operator<<(aoStack_198,"\n");
            goto LAB_003ec5b2;
          }
          varname.field_2._12_4_ = 4;
        }
        else {
LAB_003ec5b2:
          bVar2 = XformOp::has_timesamples((XformOp *)local_250);
          if (bVar2) {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_368,local_278);
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,local_368);
            ::std::__cxx11::string::~string((string *)local_368);
            if (sVar7 != 0) {
              varname.field_2._12_4_ = 4;
              goto LAB_003ec81a;
            }
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388,local_278);
            pVar9 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&i,local_388);
            local_398 = (_Base_ptr)pVar9.first._M_node;
            local_390 = pVar9.second;
            ::std::__cxx11::string::~string((string *)local_388);
            pprint::Indent_abi_cxx11_(&local_3b8,(pprint *)(ulong)local_1c,n);
            ::std::operator<<(aoStack_198,(string *)&local_3b8);
            ::std::__cxx11::string::~string((string *)&local_3b8);
            XformOp::get_value_type_name_abi_cxx11_
                      ((string *)((long)&pv_1.contained + 0x18),(XformOp *)local_250);
            poVar8 = ::std::operator<<(aoStack_198,(string *)((long)&pv_1.contained + 0x18));
            ::std::operator<<(poVar8," ");
            ::std::__cxx11::string::~string((string *)((long)&pv_1.contained + 0x18));
            ::std::operator<<(aoStack_198,(string *)local_278);
            ::std::operator<<(aoStack_198,".timeSamples");
            ::std::operator<<(aoStack_198," = ");
            XformOp::get_timesamples(&local_428,(XformOp *)local_250);
            nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::
            optional<tinyusdz::value::TimeSamples,_0>
                      ((optional<tinyusdz::value::TimeSamples> *)local_400,&local_428);
            nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::~optional(&local_428);
            bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_400);
            if (bVar2) {
              this_01 = nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::value
                                  ((optional<tinyusdz::value::TimeSamples> *)local_400);
              print_timesamples_abi_cxx11_
                        (&local_448,(tinyusdz *)this_01,(TimeSamples *)(ulong)local_1c,indent_00);
              ::std::operator<<(aoStack_198,(string *)&local_448);
              ::std::__cxx11::string::~string((string *)&local_448);
            }
            else {
              ::std::operator<<(aoStack_198,"[InternalError]");
            }
            nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::~optional
                      ((optional<tinyusdz::value::TimeSamples> *)local_400);
            ::std::operator<<(aoStack_198,"\n");
          }
          varname.field_2._12_4_ = 0;
        }
LAB_003ec81a:
        ::std::__cxx11::string::~string((string *)local_278);
      }
      XformOp::~XformOp((XformOp *)local_250);
    }
  }
  print_xformOpOrder_abi_cxx11_
            (&local_468,ptStack_18,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)local_1c,
             (uint32_t)sVar4);
  ::std::operator<<(aoStack_198,(string *)&local_468);
  ::std::__cxx11::string::~string((string *)&local_468);
  ::std::__cxx11::stringstream::str();
  varname.field_2._12_4_ = 1;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&i);
  ::std::__cxx11::stringstream::~stringstream
            ((stringstream *)&printed_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

std::string print_xformOps(const std::vector<XformOp> &xformOps,
                           const uint32_t indent) {
  std::stringstream ss;

  // To prevent printing xformOp attributes multiple times.
  std::set<std::string> printed_vars;

  // xforms props
  if (xformOps.size()) {
    for (size_t i = 0; i < xformOps.size(); i++) {
      const auto xformOp = xformOps[i];

      if (xformOp.op_type == XformOp::OpType::ResetXformStack) {
        // No need to print value.
        continue;
      }

      std::string varname = to_string(xformOp.op_type);
      if (!xformOp.suffix.empty()) {
        varname += ":" + xformOp.suffix;
      }

      DCOUT("has_default " << xformOp.has_default());
      DCOUT("has_timesamples " << xformOp.has_timesamples());

      if (xformOp.has_default()) {
        if (printed_vars.count(varname)) {
          continue;
        }

        printed_vars.insert(varname);

        ss << pprint::Indent(indent);
        ss << xformOp.get_value_type_name() << " ";
        ss << varname;
        ss << " = ";

        if (xformOp.is_blocked()) {
          ss << "None";
        } else if (auto pv = xformOp.get_scalar()) {
          ss << value::pprint_value(pv.value(), indent);
        } else {
          ss << "[InternalError]";
        }

        // TODO: metadata
        ss << "\n";
      }

      if (xformOp.has_timesamples()) {

        if (printed_vars.count(varname + ".timeSamples")) {
          continue;
        }

        printed_vars.insert(varname + ".timeSamples");

        ss << pprint::Indent(indent);
        ss << xformOp.get_value_type_name() << " ";
        ss << varname;
        ss << ".timeSamples";
        ss << " = ";

        if (auto pv = xformOp.get_timesamples()) {
          ss << print_timesamples(pv.value(), indent);
        } else {
          ss << "[InternalError]";
        }
        ss << "\n";
      }

    }
  }

  // uniform token[] xformOpOrder
  ss << print_xformOpOrder(xformOps, indent);

  return ss.str();
}